

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

void hmm_clear_scores(hmm_t *h)

{
  byte bVar1;
  long lVar2;
  
  h->state[0].score = -0x38000000;
  bVar1 = h->n_emit_state;
  if (1 < bVar1) {
    lVar2 = 0;
    do {
      *(undefined4 *)((long)&h->state[1].score + lVar2) = 0xc8000000;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)bVar1 * 0x10 + -0x10 != lVar2);
  }
  (h->out).score = -0x38000000;
  h->bestscore = -0x38000000;
  return;
}

Assistant:

void
hmm_clear_scores(hmm_t * h)
{
    int32 i;

    hmm_in_score(h) = WORST_SCORE;
    for (i = 1; i < hmm_n_emit_state(h); i++)
        hmm_score(h, i) = WORST_SCORE;
    hmm_out_score(h) = WORST_SCORE;

    h->bestscore = WORST_SCORE;
}